

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.h
# Opt level: O0

int __thiscall CTcPrsExport::ext_name_matches(CTcPrsExport *this,char *txt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s1;
  void *in_RSI;
  CTcPrsExport *in_RDI;
  undefined1 local_11;
  
  sVar2 = get_ext_len(in_RDI);
  sVar3 = get_strlen((textchar_t *)0x225ffc);
  local_11 = false;
  if (sVar2 == sVar3) {
    __s1 = get_ext_name(in_RDI);
    sVar2 = get_ext_len(in_RDI);
    iVar1 = memcmp(__s1,in_RSI,sVar2);
    local_11 = iVar1 == 0;
  }
  return (int)local_11;
}

Assistant:

int ext_name_matches(const char *txt) const
    {
        return (get_ext_len() == get_strlen(txt)
                && memcmp(get_ext_name(), txt, get_ext_len()) == 0);
    }